

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_ai_lookup.hpp
# Opt level: O0

void __thiscall
PatchOptimizeAILookup::inject_code(PatchOptimizeAILookup *this,ROM *rom,World *world)

{
  uint32_t value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  size_type sVar1;
  LandstalkerException *this_01;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  AddressRegister local_260;
  AddressInRegister local_250;
  DataRegister local_230;
  AddressRegister local_220;
  DataRegister local_210;
  allocator<char> local_1f9;
  string local_1f8;
  DataRegister local_1d8;
  DataRegister local_1c8;
  AddressRegister local_1b8;
  AddressWithIndex local_1a8;
  AddressRegister local_188;
  DataRegister local_178;
  DataRegister local_168;
  DataRegister local_158;
  DataRegister local_148;
  DataRegister local_138;
  DataRegister local_128;
  DataRegister local_118;
  DataRegister local_108;
  DataRegister local_f8;
  AddressRegister local_e8;
  AddressInRegister local_d8;
  DataRegister local_a8;
  undefined1 local_98 [8];
  Code func;
  World *world_local;
  ROM *rom_local;
  PatchOptimizeAILookup *this_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)world;
  md::Code::Code((Code *)local_98);
  md::DataRegister::DataRegister(&local_a8,'\0');
  md::Code::moveq((Code *)local_98,'\0',&local_a8);
  md::AddressRegister::AddressRegister(&local_e8,'\x05');
  addr_<int>(&local_d8,&local_e8,0x3b);
  md::DataRegister::DataRegister(&local_f8,'\0');
  md::Code::moveb((Code *)local_98,&local_d8.super_Param,(Param *)&local_f8);
  md::DataRegister::DataRegister(&local_108,'\0');
  md::DataRegister::DataRegister(&local_118,'\0');
  md::Code::addw((Code *)local_98,(Param *)&local_108,&local_118,false);
  md::DataRegister::DataRegister(&local_128,'\0');
  md::DataRegister::DataRegister(&local_138,'\0');
  md::Code::addw((Code *)local_98,(Param *)&local_128,&local_138,false);
  md::DataRegister::DataRegister(&local_148,'\0');
  md::DataRegister::DataRegister(&local_158,'\0');
  md::Code::addw((Code *)local_98,(Param *)&local_148,&local_158,false);
  md::DataRegister::DataRegister(&local_168,'\x01');
  md::DataRegister::DataRegister(&local_178,'\0');
  md::Code::addw((Code *)local_98,(Param *)&local_168,&local_178,false);
  value = this->_ai_table_addr;
  md::AddressRegister::AddressRegister(&local_188,'\0');
  md::Code::lea((Code *)local_98,value,&local_188);
  md::AddressRegister::AddressRegister(&local_1b8,'\0');
  md::DataRegister::DataRegister(&local_1c8,'\0');
  addr_<void>(&local_1a8,&local_1b8,&local_1c8,'\0',LONG);
  md::DataRegister::DataRegister(&local_1d8,'\0');
  md::Code::movel((Code *)local_98,&local_1a8.super_Param,(Param *)&local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"default_address",&local_1f9);
  md::Code::bmi((Code *)local_98,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  md::DataRegister::DataRegister(&local_210,'\0');
  md::AddressRegister::AddressRegister(&local_220,'\0');
  md::Code::movel((Code *)local_98,(Param *)&local_210,(Param *)&local_220);
  md::DataRegister::DataRegister(&local_230,'\0');
  md::Code::moveq((Code *)local_98,'\0',&local_230);
  md::AddressRegister::AddressRegister(&local_260,'\0');
  addr_<void>(&local_250,&local_260);
  md::Code::jmp((Code *)local_98,&local_250.super_Param);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"default_address",&local_281);
  md::Code::label((Code *)local_98,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  md::Code::jsr((Code *)local_98,0x1a8ada);
  md::Code::rts((Code *)local_98);
  md::ROM::set_code(rom,0x1a83f0,(Code *)local_98);
  this_00 = md::Code::get_bytes((Code *)local_98);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  if (0x1a8418 < sVar1 + 0x1a83f0) {
    this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,
               "Replacement function is too large and is overlapping other code!",&local_2a9);
    LandstalkerException::LandstalkerException(this_01,&local_2a8);
    __cxa_throw(this_01,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  md::Code::~Code((Code *)local_98);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        md::Code func;
        {
            func.moveq(0, reg_D0);
            // Store entity ID in D0, and multiply it by 8 to form an offset
            func.moveb(addr_(reg_A5, 0x3B), reg_D0);
            func.addw(reg_D0, reg_D0);
            func.addw(reg_D0, reg_D0);
            func.addw(reg_D0, reg_D0);
            // Add "offset" D1 (initialized externally, either 0 or 4) to get AI variant A or B.
            func.addw(reg_D1, reg_D0);
            // Fetch the address from the AI jump table, storing it in D0 to save a CMPA
            func.lea(_ai_table_addr, reg_A0);
            func.movel(addr_(reg_A0, reg_D0), reg_D0);
            func.bmi("default_address");
            {
                // Put the address back in an address register, and jump on it
                func.movel(reg_D0, reg_A0);
                func.moveq(0, reg_D0);
                func.jmp(addr_(reg_A0));
            }
            func.label("default_address");
            {
                func.jsr(0x1A8ADA); // LoadSpecialAI
                func.rts();
            }
        }

        rom.set_code(0x1A83F0, func);
        if(0x1A83F0 + func.get_bytes().size() > offsets::ENEMY_AI_TABLE)
            throw LandstalkerException("Replacement function is too large and is overlapping other code!");
    }